

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O2

void __thiscall cmCursesLongMessageForm::HandleInput(cmCursesLongMessageForm *this)

{
  uint uVar1;
  int iVar2;
  char debugMessage [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    uVar1 = wgetch(_stdscr);
    sprintf(debugMessage,"Message widget handling input, key: %d",(ulong)uVar1);
    cmCursesForm::LogMessage(debugMessage);
    if (uVar1 == 4) {
LAB_0025f89e:
      iVar2 = 0x22c;
LAB_0025f8a3:
      form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,iVar2);
    }
    else {
      iVar2 = 0x22a;
      if (uVar1 == 0xe) goto LAB_0025f8a3;
      if (uVar1 == 0x10) {
LAB_0025f897:
        iVar2 = 0x22b;
        goto LAB_0025f8a3;
      }
      if (uVar1 == 0x15) {
LAB_0025f890:
        iVar2 = 0x22d;
        goto LAB_0025f8a3;
      }
      if (uVar1 == 0x102) goto LAB_0025f8a3;
      if (uVar1 == 0x103) goto LAB_0025f897;
      if (uVar1 == 0x152) goto LAB_0025f89e;
      if (uVar1 == 0x153) goto LAB_0025f890;
      if (uVar1 == 0x65) {
        return;
      }
      if (uVar1 == 0x6f) {
        return;
      }
    }
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this);
    iVar2 = -1;
    if (_stdscr != 0) {
      iVar2 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar2,1);
    wrefresh(_stdscr);
  } while( true );
}

Assistant:

void cmCursesLongMessageForm::HandleInput()
{
  if (!this->Form)
    {
    return;
    }

  char debugMessage[128];

  for(;;)
    {
    int key = getch();

    sprintf(debugMessage, "Message widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    // quit
    if ( key == 'o' || key == 'e' )
      {
      break;
      }
    else if ( key == KEY_DOWN || key == ctrl('n') )
      {
      form_driver(this->Form, REQ_SCR_FLINE);
      }
    else if ( key == KEY_UP  || key == ctrl('p') )
      {
      form_driver(this->Form, REQ_SCR_BLINE);
      }
    else if ( key == KEY_NPAGE || key == ctrl('d') )
      {
      form_driver(this->Form, REQ_SCR_FPAGE);
      }
    else if ( key == KEY_PPAGE || key == ctrl('u') )
      {
      form_driver(this->Form, REQ_SCR_BPAGE);
      }

    this->UpdateStatusBar();
    this->PrintKeys();
    touchwin(stdscr);
    wrefresh(stdscr);
    }

}